

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O0

ParameterError str2double(double *val,char *str,long max)

{
  long lVar1;
  int *piVar2;
  size_t sVar3;
  double dVar4;
  double num;
  char *endptr;
  long max_local;
  char *str_local;
  double *val_local;
  
  if (str != (char *)0x0) {
    endptr = (char *)max;
    max_local = (long)str;
    str_local = (char *)val;
    piVar2 = __errno_location();
    *piVar2 = 0;
    dVar4 = strtod((char *)max_local,(char **)&num);
    piVar2 = __errno_location();
    lVar1 = max_local;
    if (*piVar2 == 0x22) {
      return PARAM_NUMBER_TOO_LARGE;
    }
    if ((double)(long)endptr < dVar4) {
      return PARAM_NUMBER_TOO_LARGE;
    }
    if ((num != (double)max_local) &&
       (sVar3 = strlen((char *)max_local), num == (double)(lVar1 + sVar3))) {
      *(double *)str_local = dVar4;
      return PARAM_OK;
    }
  }
  return PARAM_BAD_NUMERIC;
}

Assistant:

static ParameterError str2double(double *val, const char *str, long max)
{
  if(str) {
    char *endptr;
    double num;
    errno = 0;
    num = strtod(str, &endptr);
    if(errno == ERANGE)
      return PARAM_NUMBER_TOO_LARGE;
    if(num > max) {
      /* too large */
      return PARAM_NUMBER_TOO_LARGE;
    }
    if((endptr != str) && (endptr == str + strlen(str))) {
      *val = num;
      return PARAM_OK;  /* Ok */
    }
  }
  return PARAM_BAD_NUMERIC; /* badness */
}